

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::ListValueStats(ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *this;
  BaseStatistics *other;
  size_type sVar1;
  undefined8 *in_RDX;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  idx_t i;
  BaseStatistics *list_child_stats;
  BaseStatistics list_stats;
  BoundFunctionExpression *expr;
  vector<duckdb::BaseStatistics,_true> *child_stats;
  LogicalType *in_stack_ffffffffffffff08;
  BaseStatistics *in_stack_ffffffffffffff10;
  BaseStatistics *this_00;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> this_01;
  ulong local_b8;
  BaseStatistics *in_stack_ffffffffffffff50;
  BaseStatistics *pBVar2;
  BaseStatistics *in_stack_ffffffffffffff58;
  LogicalType *type;
  
  this = (vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)in_RDX[2];
  type = (LogicalType *)*in_RDX;
  this_01._M_head_impl =
       (BaseStatistics *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  LogicalType::LogicalType(&in_stack_ffffffffffffff10->type,in_stack_ffffffffffffff08);
  ListStats::CreateEmpty(type);
  LogicalType::~LogicalType((LogicalType *)0x201f569);
  other = ListStats::GetChildStats(in_stack_ffffffffffffff50);
  local_b8 = 0;
  this_00 = other;
  while( true ) {
    sVar1 = ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::size
                      (this);
    if (sVar1 <= local_b8) break;
    pBVar2 = this_00;
    vector<duckdb::BaseStatistics,_true>::operator[]
              ((vector<duckdb::BaseStatistics,_true> *)this_00,(size_type)in_stack_ffffffffffffff08)
    ;
    BaseStatistics::Merge(this_01._M_head_impl,other);
    local_b8 = local_b8 + 1;
    in_stack_ffffffffffffff10 = this_00;
    this_00 = pBVar2;
  }
  BaseStatistics::ToUnique(in_stack_ffffffffffffff58);
  BaseStatistics::~BaseStatistics(in_stack_ffffffffffffff10);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BaseStatistics> ListValueStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto list_stats = ListStats::CreateEmpty(expr.return_type);
	auto &list_child_stats = ListStats::GetChildStats(list_stats);
	for (idx_t i = 0; i < child_stats.size(); i++) {
		list_child_stats.Merge(child_stats[i]);
	}
	return list_stats.ToUnique();
}